

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

uchar * BUFFER_u_char(BUFFER_HANDLE handle)

{
  if ((handle != (BUFFER_HANDLE)0x0) && (handle->size != 0)) {
    return handle->buffer;
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char* BUFFER_u_char(BUFFER_HANDLE handle)
{
    BUFFER* handleData = (BUFFER*)handle;
    unsigned char* result;
    if (handle == NULL || handleData->size == 0)
    {
        /* Codes_SRS_BUFFER_07_026: [BUFFER_u_char shall return NULL for any error that is encountered.] */
        /* Codes_SRS_BUFFER_07_029: [BUFFER_u_char shall return NULL if underlying buffer size is zero.] */
        result = NULL;
    }
    else
    {
        result = handleData->buffer;
    }
    return result;
}